

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboCases::StencilClearsTest::render
          (StencilClearsTest *this,Context *context,Surface *dst)

{
  float fVar1;
  DataType outputType;
  deUint32 program;
  deUint32 program_00;
  uint uVar2;
  uint uVar3;
  int in_R9D;
  Vec4 local_448;
  Surface *local_430;
  Framebuffer fbo;
  Vec4 local_3e8;
  Vec4 fboOutBias;
  Vec4 fboOutScale;
  TextureFormat colorFormat;
  TextureFormatInfo fboRangeInfo;
  Texture2DShader texFromFboShader;
  Texture2DShader texToFboShader;
  
  local_430 = dst;
  colorFormat = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
  fVar1 = (float)glu::getSampler2DType(colorFormat);
  outputType = FboTestUtil::getFragmentOutputType(&colorFormat);
  tcu::getTextureFormatInfo(&fboRangeInfo,&colorFormat);
  fboOutScale.m_data[0] = fboRangeInfo.valueMax.m_data[0] - fboRangeInfo.valueMin.m_data[0];
  fboOutScale.m_data[1] = fboRangeInfo.valueMax.m_data[1] - fboRangeInfo.valueMin.m_data[1];
  fboOutScale.m_data[2] = fboRangeInfo.valueMax.m_data[2] - fboRangeInfo.valueMin.m_data[2];
  fboOutScale.m_data[3] = fboRangeInfo.valueMax.m_data[3] - fboRangeInfo.valueMin.m_data[3];
  texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fbo.m_config.buffers = 0x28;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&texFromFboShader,(iterator)0x0,
             (DataType *)&fbo);
  fbo.m_config.buffers = 0x3f800000;
  fbo.m_config.colorType = 0x3f800000;
  fbo.m_config.colorFormat = 0x3f800000;
  fbo.m_config.depthStencilType = 0x3f800000;
  local_448.m_data[0] = 0.0;
  local_448.m_data[1] = 0.0;
  local_448.m_data[2] = 0.0;
  local_448.m_data[3] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFboShader,(DataTypes *)&texFromFboShader,outputType,(Vec4 *)&fbo,&local_448);
  if (texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader !=
      (_func_int **)0x0) {
    operator_delete(texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
                   );
  }
  fbo.m_config.buffers = 0;
  fbo.m_config.colorType = 0;
  fbo.m_config.colorFormat = 0;
  fbo.m_config.depthStencilType = 0;
  fbo.m_config.depthStencilFormat = 0;
  fbo.m_config.width = 0;
  local_448.m_data[0] = fVar1;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&fbo,(iterator)0x0,
             (DataType *)&local_448);
  local_448.m_data[0] = 1.0;
  local_448.m_data[1] = 1.0;
  local_448.m_data[2] = 1.0;
  local_448.m_data[3] = 1.0;
  local_3e8.m_data[0] = 0.0;
  local_3e8.m_data[1] = 0.0;
  local_3e8.m_data[2] = 0.0;
  local_3e8.m_data[3] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texFromFboShader,(DataTypes *)&fbo,TYPE_FLOAT_VEC4,&local_448,&local_3e8);
  if (fbo.m_config._0_8_ != 0) {
    operator_delete((void *)fbo.m_config._0_8_,fbo.m_config._16_8_ - fbo.m_config._0_8_);
  }
  program = (*context->_vptr_Context[0x75])(context,&texToFboShader);
  program_00 = (*context->_vptr_Context[0x75])(context,&texFromFboShader);
  FboTestUtil::Texture2DShader::setOutScaleBias(&texToFboShader,&fboOutScale,&fboOutBias);
  FboTestUtil::Texture2DShader::setTexScaleBias
            (&texFromFboShader,0,&fboRangeInfo.lookupScale,&fboRangeInfo.lookupBias);
  createQuadsTex2D(context,2,0x1908,0x80,0x80,in_R9D);
  createMetaballsTex2D(context,1,0x1908,0x80,0x80,in_R9D);
  Functional::Framebuffer::Framebuffer
            (&fbo,context,&(this->super_FboRenderCase).m_config,0x80,0x80,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fbo);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fbo.m_framebuffer);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  (*context->_vptr_Context[0x33])(context,0xc11);
  (*context->_vptr_Context[0x32])(context,10,0x10,0x20,0x78);
  (*context->_vptr_Context[0x2c])(context,1);
  (*context->_vptr_Context[0x2d])(context,0x400);
  (*context->_vptr_Context[0x32])(context,0x10,0x20,100,0x40);
  (*context->_vptr_Context[0x2c])(context,2);
  (*context->_vptr_Context[0x2d])(context,0x400);
  (*context->_vptr_Context[0x34])(context,0xc11);
  (*context->_vptr_Context[0x33])(context,0xb90);
  (*context->_vptr_Context[6])(context,0xde1,2);
  (*context->_vptr_Context[0x35])(context,0x202,1,0xff);
  FboTestUtil::Texture2DShader::setUniforms(&texToFboShader,context,program);
  local_448.m_data[0] = -1.0;
  local_448.m_data[1] = -1.0;
  local_448.m_data._8_8_ = local_448.m_data._8_8_ & 0xffffffff00000000;
  local_3e8.m_data[0] = 1.0;
  local_3e8.m_data[1] = 1.0;
  local_3e8.m_data._8_8_ = local_3e8.m_data._8_8_ & 0xffffffff00000000;
  sglr::drawQuad(context,program,(Vec3 *)&local_448,(Vec3 *)&local_3e8);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x35])(context,0x202,2,0xff);
  FboTestUtil::Texture2DShader::setUniforms(&texToFboShader,context,program);
  local_448.m_data[0] = -1.0;
  local_448.m_data[1] = -1.0;
  local_448.m_data._8_8_ = local_448.m_data._8_8_ & 0xffffffff00000000;
  local_3e8.m_data[0] = 1.0;
  local_3e8.m_data[1] = 1.0;
  local_3e8.m_data._8_8_ = local_3e8.m_data._8_8_ & 0xffffffff00000000;
  sglr::drawQuad(context,program,(Vec3 *)&local_448,(Vec3 *)&local_3e8);
  (*context->_vptr_Context[0x34])(context,0xb90);
  if (fbo.m_config.colorType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_colorBuffer);
    uVar2 = (*context->_vptr_Context[2])(context);
    uVar3 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar2,(ulong)uVar3);
    FboTestUtil::Texture2DShader::setUniforms(&texFromFboShader,context,program_00);
    local_448.m_data[0] = -1.0;
    local_448.m_data[1] = -1.0;
    local_448.m_data._8_8_ = local_448.m_data._8_8_ & 0xffffffff00000000;
    local_3e8.m_data[0] = 1.0;
    local_3e8.m_data[1] = 1.0;
    local_3e8.m_data._8_8_ = local_3e8.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(context,program_00,(Vec3 *)&local_448,(Vec3 *)&local_3e8);
    uVar2 = (*context->_vptr_Context[2])(context);
    uVar3 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[0x80])(context,local_430,0,0,(ulong)uVar2,(ulong)uVar3);
  }
  else {
    FboTestUtil::readPixels
              (context,local_430,0,0,0x80,0x80,&colorFormat,&fboRangeInfo.lookupScale,
               &fboRangeInfo.lookupBias);
  }
  Functional::Framebuffer::~Framebuffer(&fbo);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texFromFboShader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFboShader);
  return;
}

Assistant:

void StencilClearsTest::render (sglr::Context& context, Surface& dst)
{
	tcu::TextureFormat		colorFormat			= glu::mapGLInternalFormat(m_config.colorFormat);
	glu::DataType			fboSamplerType		= glu::getSampler2DType(colorFormat);
	glu::DataType			fboOutputType		= getFragmentOutputType(colorFormat);
	tcu::TextureFormatInfo	fboRangeInfo		= tcu::getTextureFormatInfo(colorFormat);
	Vec4					fboOutScale			= fboRangeInfo.valueMax - fboRangeInfo.valueMin;
	Vec4					fboOutBias			= fboRangeInfo.valueMin;

	Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, fboOutputType);
	Texture2DShader			texFromFboShader	(DataTypes() << fboSamplerType, glu::TYPE_FLOAT_VEC4);

	deUint32				texToFboShaderID	= context.createProgram(&texToFboShader);
	deUint32				texFromFboShaderID	= context.createProgram(&texFromFboShader);

	deUint32				metaballsTex		= 1;
	deUint32				quadsTex			= 2;
	int						width				= 128;
	int						height				= 128;

	texToFboShader.setOutScaleBias(fboOutScale, fboOutBias);
	texFromFboShader.setTexScaleBias(0, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);

	createQuadsTex2D(context, quadsTex, GL_RGBA, GL_UNSIGNED_BYTE, width, height);
	createMetaballsTex2D(context, metaballsTex, GL_RGBA, GL_UNSIGNED_BYTE, width, height);

	Framebuffer fbo(context, m_config, width, height);
	fbo.checkCompleteness();

	// Bind framebuffer and clear
	context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	context.viewport(0, 0, width, height);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Do stencil clears
	context.enable(GL_SCISSOR_TEST);
	context.scissor(10, 16, 32, 120);
	context.clearStencil(1);
	context.clear(GL_STENCIL_BUFFER_BIT);
	context.scissor(16, 32, 100, 64);
	context.clearStencil(2);
	context.clear(GL_STENCIL_BUFFER_BIT);
	context.disable(GL_SCISSOR_TEST);

	// Draw 2 textures with stecil tests
	context.enable(GL_STENCIL_TEST);

	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.stencilFunc(GL_EQUAL, 1, 0xffu);

	texToFboShader.setUniforms(context, texToFboShaderID);
	sglr::drawQuad(context, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	context.stencilFunc(GL_EQUAL, 2, 0xffu);

	texToFboShader.setUniforms(context, texToFboShaderID);
	sglr::drawQuad(context, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

	context.disable(GL_STENCIL_TEST);

	if (fbo.getConfig().colorType == GL_TEXTURE_2D)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		context.viewport(0, 0, context.getWidth(), context.getHeight());

		texFromFboShader.setUniforms(context, texFromFboShaderID);
		sglr::drawQuad(context, texFromFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		readPixels(context, dst, 0, 0, width, height, colorFormat, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
}